

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *
ggml_backend_cpu_get_extra_buffers_type(void)

{
  int iVar1;
  anon_class_1_0_00000001 *in_stack_00000028;
  
  if (ggml_backend_cpu_get_extra_buffers_type()::bufts == '\0') {
    iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_get_extra_buffers_type()::bufts);
    if (iVar1 != 0) {
      ggml_backend_cpu_get_extra_buffers_type::anon_class_1_0_00000001::operator()
                (in_stack_00000028);
      __cxa_atexit(std::
                   vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
                   ~vector,&ggml_backend_cpu_get_extra_buffers_type::bufts,&__dso_handle);
      __cxa_guard_release(&ggml_backend_cpu_get_extra_buffers_type()::bufts);
    }
  }
  return &ggml_backend_cpu_get_extra_buffers_type::bufts;
}

Assistant:

std::vector<ggml_backend_buffer_type_t>& ggml_backend_cpu_get_extra_buffers_type() {
    static std::vector<ggml_backend_buffer_type_t> bufts = []() {
        std::vector<ggml_backend_buffer_type_t> bufts;

#if defined(__AMX_INT8__) && defined(__AVX512VNNI__)
        if (ggml_backend_amx_buffer_type()) {
            bufts.push_back(ggml_backend_amx_buffer_type());
        }
#endif

#ifdef GGML_USE_CPU_KLEIDIAI
        if (ggml_backend_cpu_kleidiai_buffer_type()) {
            bufts.push_back(ggml_backend_cpu_kleidiai_buffer_type());
        }
#endif

#ifdef GGML_USE_CPU_AARCH64
        if (ggml_backend_cpu_aarch64_buffer_type()) {
            bufts.push_back(ggml_backend_cpu_aarch64_buffer_type());
        }
#endif

        bufts.push_back(NULL);

        return bufts;
    }();

    return bufts;
}